

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O2

void __thiscall Assimp::ObjFileParser::copyNextWord(ObjFileParser *this,char *pBuffer,size_t length)

{
  byte bVar1;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var2;
  ulong uVar3;
  
  _Var2 = getNextWord<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
  (this->m_DataIt)._M_current = _Var2._M_current;
  if (*_Var2._M_current == '\\') {
    (this->m_DataIt)._M_current = _Var2._M_current + 2;
    _Var2 = getNextWord<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                      (_Var2._M_current + 2,(this->m_DataItEnd)._M_current);
    (this->m_DataIt)._M_current = _Var2._M_current;
  }
  uVar3 = 0;
  do {
    if (_Var2._M_current == (this->m_DataItEnd)._M_current) {
LAB_0045458e:
      if (uVar3 < length) {
        pBuffer[uVar3] = '\0';
        return;
      }
      __assert_fail("index < length",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Obj/ObjFileParser.cpp"
                    ,0x104,"void Assimp::ObjFileParser::copyNextWord(char *, size_t)");
    }
    bVar1 = *_Var2._M_current;
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
    goto LAB_0045458e;
    pBuffer[uVar3] = bVar1;
    if (length - 2 == uVar3) {
      uVar3 = uVar3 + 1;
      goto LAB_0045458e;
    }
    _Var2._M_current = (this->m_DataIt)._M_current + 1;
    (this->m_DataIt)._M_current = _Var2._M_current;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void ObjFileParser::copyNextWord(char *pBuffer, size_t length) {
    size_t index = 0;
    m_DataIt = getNextWord<DataArrayIt>(m_DataIt, m_DataItEnd);
    if ( *m_DataIt == '\\' ) {
        ++m_DataIt;
        ++m_DataIt;
        m_DataIt = getNextWord<DataArrayIt>( m_DataIt, m_DataItEnd );
    }
    while( m_DataIt != m_DataItEnd && !IsSpaceOrNewLine( *m_DataIt ) ) {
        pBuffer[index] = *m_DataIt;
        index++;
        if( index == length - 1 ) {
            break;
        }
        ++m_DataIt;
    }

    ai_assert(index < length);
    pBuffer[index] = '\0';
}